

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O2

void __thiscall
capnp::compiler::Declaration::Param::DefaultValue::Builder::adoptValue
          (Builder *this,Orphan<capnp::compiler::Expression> *value)

{
  PointerBuilder local_18;
  
  *(undefined2 *)(this->_builder).data = 1;
  local_18.pointer = (this->_builder).pointers + 3;
  local_18.segment = (this->_builder).segment;
  local_18.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::adopt(&local_18,&value->builder);
  return;
}

Assistant:

inline void Declaration::Param::DefaultValue::Builder::adoptValue(
    ::capnp::Orphan< ::capnp::compiler::Expression>&& value) {
  _builder.setDataField<Declaration::Param::DefaultValue::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Declaration::Param::DefaultValue::VALUE);
  ::capnp::_::PointerHelpers< ::capnp::compiler::Expression>::adopt(_builder.getPointerField(
      ::capnp::bounded<3>() * ::capnp::POINTERS), kj::mv(value));
}